

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeakReport.cpp
# Opt level: O0

void Memory::LeakReport::StartRedirectOutput(void)

{
  code *pcVar1;
  bool bVar2;
  PAL_FILE *file;
  undefined8 *in_FS_OFFSET;
  
  bVar2 = EnsureLeakReportFile();
  if (bVar2) {
    CCLock::Enter(&s_cs.super_CCLock);
    if (nestedRedirectOutputCount == 0) {
      if (oldFile != (PAL_FILE *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LeakReport.cpp"
                           ,0x2b,"(oldFile == nullptr)","oldFile == nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      file = (PAL_FILE *)BasePtr::operator_cast_to__PAL_FILE_((BasePtr *)&LeakReport::file);
      oldFile = Output::SetFile(file);
    }
    nestedRedirectOutputCount = nestedRedirectOutputCount + 1;
  }
  return;
}

Assistant:

void
LeakReport::StartRedirectOutput()
{
    if (!EnsureLeakReportFile())
    {
        return;
    }
    s_cs.Enter();
    if (nestedRedirectOutputCount == 0)
    {
        Assert(oldFile == nullptr);
        oldFile = Output::SetFile(file);
    }
    nestedRedirectOutputCount++;
}